

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

int fiobj_data_save_file(FIOBJ o,char *filename)

{
  int *piVar1;
  size_t __n;
  ssize_t sVar2;
  ssize_t act2;
  ssize_t act;
  size_t total;
  char buf [1024];
  int target;
  char *filename_local;
  FIOBJ o_local;
  
  buf._1020_4_ = open(filename,0x242,0x1ff);
  if (buf._1020_4_ == -1) {
    o_local._4_4_ = -1;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    act = 0;
    while (__n = pread(*(int *)(o + 0x30),&total,0x400,act), __n != 0) {
      if (((long)__n < 0) || (sVar2 = write(buf._1020_4_,&total,__n), sVar2 < (long)__n)) {
        close(buf._1020_4_);
        unlink(filename);
        return -1;
      }
      act = sVar2 + act;
    }
    close(buf._1020_4_);
    o_local._4_4_ = 0;
  }
  return o_local._4_4_;
}

Assistant:

static int fiobj_data_save_file(FIOBJ o, const char *filename) {
  int target = open(filename, O_RDWR | O_CREAT | O_TRUNC, 0777);
  if (target == -1)
    return -1;
  errno = 0;
  char buf[1024];
  size_t total = 0;
  do {
    ssize_t act = pread(obj2io(o)->fd, buf, 1024, total);
    if (act == 0)
      break;
    if (act < 0)
      goto error;
    ssize_t act2 = write(target, buf, act);
    if (act2 < act)
      goto error;
    total += act2;
  } while (1);
  close(target);
  return 0;
error:
  close(target);
  unlink(filename);
  return -1;
}